

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_test.cpp
# Opt level: O0

void __thiscall Image_ExrMetadata_Test::TestBody(Image_ExrMetadata_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  Point2i res_00;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  bool bVar1;
  undefined1 uVar2;
  iterator expression_text;
  pointer ppVar3;
  char *__filename;
  undefined4 uVar4;
  double dVar5;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar__6;
  iterator iter;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar__5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar;
  ImageMetadata *inMetadata;
  ImageAndMetadata read;
  AssertionResult gtest_ar_;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  stringVectors;
  Point2i fullRes;
  Bounds2i pb;
  SquareMatrix<4> w2n;
  SquareMatrix<4> w2c;
  ImageMetadata outMetadata;
  string filename;
  Image image;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> rgbPixels;
  Point2i res;
  RGBColorSpace **in_stack_fffffffffffff358;
  ImageMetadata *this_00;
  ImageMetadata *in_stack_fffffffffffff360;
  ImageAndMetadata *this_01;
  undefined4 in_stack_fffffffffffff368;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffff36c;
  undefined4 in_stack_fffffffffffff370;
  undefined4 in_stack_fffffffffffff374;
  undefined4 in_stack_fffffffffffff378;
  undefined4 uVar7;
  int in_stack_fffffffffffff37c;
  undefined4 in_stack_fffffffffffff380;
  undefined4 uVar8;
  int in_stack_fffffffffffff384;
  int args_12;
  Type in_stack_fffffffffffff38c;
  undefined4 in_stack_fffffffffffff390;
  undefined4 uVar9;
  undefined4 in_stack_fffffffffffff394;
  key_type *in_stack_fffffffffffff398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff3a0;
  undefined7 in_stack_fffffffffffff3a8;
  undefined1 in_stack_fffffffffffff3af;
  double in_stack_fffffffffffff3b0;
  int in_stack_fffffffffffff3b8;
  int in_stack_fffffffffffff3bc;
  char *in_stack_fffffffffffff3c0;
  int in_stack_fffffffffffff3c8;
  undefined2 in_stack_fffffffffffff3cc;
  undefined1 in_stack_fffffffffffff3ce;
  undefined1 in_stack_fffffffffffff3cf;
  SquareMatrix<4> *in_stack_fffffffffffff3d0;
  AssertionResult *in_stack_fffffffffffff3d8;
  AssertionResult *assertion_result;
  AssertHelper *in_stack_fffffffffffff3e0;
  undefined7 in_stack_fffffffffffff3e8;
  undefined1 in_stack_fffffffffffff3ef;
  float args_9;
  undefined8 in_stack_fffffffffffff3f0;
  float in_stack_fffffffffffff3f8;
  int in_stack_fffffffffffff3fc;
  float args_14;
  undefined8 in_stack_fffffffffffff400;
  int args_5;
  undefined8 in_stack_fffffffffffff410;
  int in_stack_fffffffffffff418;
  int args_8;
  undefined8 in_stack_fffffffffffff420;
  int in_stack_fffffffffffff428;
  int args_10;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_stack_fffffffffffff430;
  int in_stack_fffffffffffff438;
  undefined4 in_stack_fffffffffffff43c;
  int in_stack_fffffffffffff440;
  undefined4 in_stack_fffffffffffff444;
  int in_stack_fffffffffffff448;
  undefined2 in_stack_fffffffffffff44c;
  undefined1 in_stack_fffffffffffff44e;
  undefined1 in_stack_fffffffffffff44f;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffff450;
  string *local_ae8;
  string *local_a80;
  AssertionResult local_a20 [2];
  AssertionResult local_a00 [2];
  AssertionResult local_9e0;
  string local_9d0 [48];
  _Self local_9a0;
  AssertionResult local_998;
  undefined1 local_981 [33];
  _Self local_960 [3];
  size_type local_948;
  undefined4 local_93c;
  AssertionResult local_938 [2];
  AssertionResult local_918;
  string local_908 [48];
  AssertionResult local_8d8 [2];
  AssertionResult local_8b8;
  string local_8a8 [48];
  AssertionResult local_878 [2];
  AssertionResult local_858;
  string local_848 [48];
  AssertionResult local_818 [2];
  AssertionResult local_7f8;
  string local_7e8 [48];
  AssertionResult local_7b8 [2];
  undefined4 local_794;
  AssertionResult local_790;
  string local_780 [48];
  AssertionResult local_750 [2];
  AssertionResult local_730;
  optional *local_720;
  optional local_5f0 [256];
  string local_4f0 [48];
  AssertionResult local_4c0;
  allocator<char> local_4a9;
  string local_4a8 [37];
  undefined1 local_483;
  allocator<char> local_482;
  allocator<char> local_481;
  string *local_480;
  string local_478;
  undefined1 local_458 [24];
  ImageMetadata *in_stack_fffffffffffffbc0;
  string *name;
  Image *this_02;
  allocator<char> local_241;
  string local_240 [36];
  undefined1 local_21c;
  allocator<char> local_21b;
  allocator<char> local_21a;
  allocator<char> local_219;
  string *local_218;
  string local_210 [8];
  ColorEncodingHandle *in_stack_fffffffffffffdf8;
  string *in_stack_fffffffffffffe00;
  Allocator in_stack_fffffffffffffe08;
  undefined1 local_1f0 [32];
  undefined1 local_1d0 [32];
  string *local_1b0;
  undefined8 local_1a8;
  undefined8 local_190;
  undefined8 local_38;
  undefined8 local_10;
  
  pbrt::Point2<int>::Point2
            ((Point2<int> *)in_stack_fffffffffffff360,
             (int)((ulong)in_stack_fffffffffffff358 >> 0x20),(int)in_stack_fffffffffffff358);
  local_38 = local_10;
  res_00.super_Tuple2<pbrt::Point2,_int>.y = in_stack_fffffffffffff3fc;
  res_00.super_Tuple2<pbrt::Point2,_int>.x = (int)in_stack_fffffffffffff3f8;
  GetFloatPixels(res_00,(int)((ulong)in_stack_fffffffffffff3f0 >> 0x20));
  pstd::pmr::polymorphic_allocator<float>::polymorphic_allocator
            ((polymorphic_allocator<float> *)in_stack_fffffffffffff360);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
            ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
             CONCAT44(in_stack_fffffffffffff384,in_stack_fffffffffffff380),
             (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
             CONCAT44(in_stack_fffffffffffff37c,in_stack_fffffffffffff378),
             (polymorphic_allocator<float> *)
             CONCAT44(in_stack_fffffffffffff374,in_stack_fffffffffffff370));
  local_190 = local_10;
  local_21c = 1;
  local_218 = local_210;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff3a0,(char *)in_stack_fffffffffffff398,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff394,in_stack_fffffffffffff390));
  local_218 = (string *)local_1f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff3a0,(char *)in_stack_fffffffffffff398,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff394,in_stack_fffffffffffff390));
  local_218 = (string *)local_1d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff3a0,(char *)in_stack_fffffffffffff398,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff394,in_stack_fffffffffffff390));
  local_21c = 0;
  local_1b0 = local_210;
  local_1a8 = 3;
  v._M_array._4_4_ = in_stack_fffffffffffff36c;
  v._M_array._0_4_ = in_stack_fffffffffffff368;
  v._M_len._0_4_ = in_stack_fffffffffffff370;
  v._M_len._4_4_ = in_stack_fffffffffffff374;
  pstd::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)in_stack_fffffffffffff360,v);
  channels.ptr._4_4_ = in_stack_fffffffffffff444;
  channels.ptr._0_4_ = in_stack_fffffffffffff440;
  channels.n._0_4_ = in_stack_fffffffffffff448;
  channels.n._4_2_ = in_stack_fffffffffffff44c;
  channels.n._6_1_ = in_stack_fffffffffffff44e;
  channels.n._7_1_ = in_stack_fffffffffffff44f;
  pbrt::Image::Image((Image *)CONCAT44(in_stack_fffffffffffff43c,in_stack_fffffffffffff438),
                     in_stack_fffffffffffff430,(Point2i)in_stack_fffffffffffff450,channels);
  local_a80 = (string *)&local_1b0;
  do {
    local_a80 = local_a80 + -0x20;
    std::__cxx11::string::~string(local_a80);
    args_9 = (float)in_stack_fffffffffffff3f0;
    args_10 = (int)in_stack_fffffffffffff430;
    args_5 = (int)in_stack_fffffffffffff410;
    args_14 = (float)in_stack_fffffffffffff400;
    args_8 = (int)in_stack_fffffffffffff420;
  } while (local_a80 != local_210);
  std::allocator<char>::~allocator(&local_21b);
  std::allocator<char>::~allocator(&local_21a);
  std::allocator<char>::~allocator(&local_219);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
            ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)in_stack_fffffffffffff360);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff3a0,(char *)in_stack_fffffffffffff398,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff394,in_stack_fffffffffffff390));
  std::allocator<char>::~allocator(&local_241);
  pbrt::ImageMetadata::ImageMetadata(in_stack_fffffffffffff360);
  pstd::optional<const_pbrt::RGBColorSpace_*>::operator=
            ((optional<const_pbrt::RGBColorSpace_*> *)in_stack_fffffffffffff360,
             in_stack_fffffffffffff358);
  pstd::optional<float>::operator=
            (&in_stack_fffffffffffff360->renderTimeSeconds,(float *)in_stack_fffffffffffff358);
  std::exp(SUB648(ZEXT464(0x3f800000),0));
  uVar9 = 1;
  args_12 = 8;
  uVar8 = 2;
  pbrt::SquareMatrix<4>::
  SquareMatrix<int,int,int,int,int,int,float,int,int,int,int,int,int,int,float>
            (in_stack_fffffffffffff3d0,
             (Float)CONCAT13(in_stack_fffffffffffff3cf,
                             CONCAT12(in_stack_fffffffffffff3ce,in_stack_fffffffffffff3cc)),
             in_stack_fffffffffffff3c8,(int)((ulong)in_stack_fffffffffffff3c0 >> 0x20),
             (int)in_stack_fffffffffffff3c0,in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8,
             args_5,(float)((ulong)in_stack_fffffffffffff3b0 >> 0x20),in_stack_fffffffffffff418,
             args_8,in_stack_fffffffffffff428,args_10,in_stack_fffffffffffff438,
             in_stack_fffffffffffff440,in_stack_fffffffffffff448,SUB84(in_stack_fffffffffffff3b0,0))
  ;
  dVar5 = std::cos(SUB648(ZEXT464(0x3f800000),0));
  uVar4 = SUB84(dVar5,0);
  this_01 = (ImageAndMetadata *)0x404799999999999a;
  this_00 = (ImageMetadata *)&DAT_404f99999999999a;
  uVar7 = 0x2edbe6ff;
  uVar6 = 0x40490fdb;
  pbrt::SquareMatrix<4>::
  SquareMatrix<double,double,double,double,double,double,double,double,double,float,float,int,int,int,float>
            (in_stack_fffffffffffff3d0,
             (Float)CONCAT13(in_stack_fffffffffffff3cf,
                             CONCAT12(in_stack_fffffffffffff3ce,in_stack_fffffffffffff3cc)),
             (double)in_stack_fffffffffffff3c0,
             (double)CONCAT44(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8),
             in_stack_fffffffffffff3b0,
             (double)CONCAT17(in_stack_fffffffffffff3af,in_stack_fffffffffffff3a8),
             (double)in_stack_fffffffffffff3a0,(double)in_stack_fffffffffffff398,
             (double)CONCAT44(in_stack_fffffffffffff394,uVar9),(double)in_stack_fffffffffffff3e0,
             (double)CONCAT17(in_stack_fffffffffffff3ef,in_stack_fffffffffffff3e8),args_9,
             in_stack_fffffffffffff3f8,in_stack_fffffffffffff38c,args_12,in_stack_fffffffffffff384,
             args_14);
  pbrt::Point2<int>::Point2((Point2<int> *)this_01,(int)((ulong)this_00 >> 0x20),(int)this_00);
  pbrt::Point2<int>::Point2((Point2<int> *)this_01,(int)((ulong)this_00 >> 0x20),(int)this_00);
  pbrt::Bounds2<int>::Bounds2
            ((Bounds2<int> *)CONCAT44(in_stack_fffffffffffff374,uVar4),
             (Point2<int> *)CONCAT44(in_stack_fffffffffffff36c,uVar6),(Point2<int> *)this_01);
  pbrt::Point2<int>::Point2((Point2<int> *)this_01,(int)((ulong)this_00 >> 0x20),(int)this_00);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
         *)0x5c7a60);
  local_483 = 1;
  local_480 = &local_478;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff3a0,(char *)in_stack_fffffffffffff398,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff394,uVar9));
  local_480 = (string *)local_458;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff3a0,(char *)in_stack_fffffffffffff398,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff394,uVar9));
  local_483 = 0;
  name = &local_478;
  this_02 = (Image *)0x2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff3a0,(char *)in_stack_fffffffffffff398,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff394,uVar9));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                *)in_stack_fffffffffffff3a0,in_stack_fffffffffffff398);
  __l._M_array._4_4_ = in_stack_fffffffffffff37c;
  __l._M_array._0_4_ = uVar7;
  __l._M_len._0_4_ = uVar8;
  __l._M_len._4_4_ = in_stack_fffffffffffff384;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT44(in_stack_fffffffffffff374,uVar4),__l);
  std::__cxx11::string::~string(local_4a8);
  std::allocator<char>::~allocator(&local_4a9);
  local_ae8 = (string *)&stack0xfffffffffffffbc8;
  do {
    local_ae8 = local_ae8 + -1;
    std::__cxx11::string::~string((string *)local_ae8);
  } while (local_ae8 != &local_478);
  std::allocator<char>::~allocator(&local_482);
  std::allocator<char>::~allocator(&local_481);
  pstd::optional<pbrt::SquareMatrix<4>_>::operator=
            ((optional<pbrt::SquareMatrix<4>_> *)this_01,(SquareMatrix<4> *)this_00);
  pstd::optional<pbrt::SquareMatrix<4>_>::operator=
            ((optional<pbrt::SquareMatrix<4>_> *)this_01,(SquareMatrix<4> *)this_00);
  pstd::optional<pbrt::Bounds2<int>_>::operator=
            ((optional<pbrt::Bounds2<int>_> *)this_01,(Bounds2<int> *)this_00);
  pstd::optional<pbrt::Point2<int>_>::operator=
            ((optional<pbrt::Point2<int>_> *)this_01,(Point2<int> *)this_00);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::operator=((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *)this_01,
              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *)this_00);
  pbrt::Image::Write(this_02,name,in_stack_fffffffffffffbc0);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)this_01,SUB81((ulong)this_00 >> 0x38,0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4c0);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(in_stack_fffffffffffff394,uVar9));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff3d8,(char *)in_stack_fffffffffffff3d0,
               (char *)CONCAT17(in_stack_fffffffffffff3cf,
                                CONCAT16(in_stack_fffffffffffff3ce,
                                         CONCAT24(in_stack_fffffffffffff3cc,
                                                  in_stack_fffffffffffff3c8))),
               in_stack_fffffffffffff3c0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff394,uVar9),in_stack_fffffffffffff38c,
               (char *)CONCAT44(in_stack_fffffffffffff384,uVar8),in_stack_fffffffffffff37c,
               (char *)CONCAT44(in_stack_fffffffffffff374,uVar4));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff3e0,(Message *)in_stack_fffffffffffff3d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    std::__cxx11::string::~string(local_4f0);
    testing::Message::~Message((Message *)0x5c80c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5c813b);
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
            ((polymorphic_allocator<std::byte> *)this_01);
  pbrt::ColorEncodingHandle::TaggedPointer((ColorEncodingHandle *)this_01,this_00);
  pbrt::Image::Read(in_stack_fffffffffffffe00,in_stack_fffffffffffffe08,in_stack_fffffffffffffdf8);
  local_720 = local_5f0;
  pbrt::ImageMetadata::GetColorSpace(this_00);
  testing::internal::EqHelper<false>::Compare<pbrt::RGBColorSpace,pbrt::RGBColorSpace>
            ((char *)CONCAT44(in_stack_fffffffffffff37c,uVar7),
             (char *)CONCAT44(in_stack_fffffffffffff374,uVar4),
             (RGBColorSpace *)CONCAT44(in_stack_fffffffffffff36c,uVar6),(RGBColorSpace *)this_01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_730);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(in_stack_fffffffffffff394,uVar9));
    testing::AssertionResult::failure_message((AssertionResult *)0x5c8270);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff394,uVar9),in_stack_fffffffffffff38c,
               (char *)CONCAT44(in_stack_fffffffffffff384,uVar8),in_stack_fffffffffffff37c,
               (char *)CONCAT44(in_stack_fffffffffffff374,uVar4));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff3e0,(Message *)in_stack_fffffffffffff3d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    testing::Message::~Message((Message *)0x5c82d3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5c8328);
  pstd::optional::operator_cast_to_bool(local_720);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)this_01,SUB81((ulong)this_00 >> 0x38,0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_750);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(in_stack_fffffffffffff394,uVar9));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff3d8,(char *)in_stack_fffffffffffff3d0,
               (char *)CONCAT17(in_stack_fffffffffffff3cf,
                                CONCAT16(in_stack_fffffffffffff3ce,
                                         CONCAT24(in_stack_fffffffffffff3cc,
                                                  in_stack_fffffffffffff3c8))),
               in_stack_fffffffffffff3c0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff394,uVar9),in_stack_fffffffffffff38c,
               (char *)CONCAT44(in_stack_fffffffffffff384,uVar8),in_stack_fffffffffffff37c,
               (char *)CONCAT44(in_stack_fffffffffffff374,uVar4));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff3e0,(Message *)in_stack_fffffffffffff3d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    std::__cxx11::string::~string(local_780);
    testing::Message::~Message((Message *)0x5c8456);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5c84d1);
  local_794 = 0x4d2;
  pstd::optional<float>::operator*((optional<float> *)0x5c84e9);
  testing::internal::EqHelper<false>::Compare<int,float>
            ((char *)CONCAT44(in_stack_fffffffffffff37c,uVar7),
             (char *)CONCAT44(in_stack_fffffffffffff374,uVar4),
             (int *)CONCAT44(in_stack_fffffffffffff36c,uVar6),(float *)this_01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_790);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(in_stack_fffffffffffff394,uVar9));
    testing::AssertionResult::failure_message((AssertionResult *)0x5c858f);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff394,uVar9),in_stack_fffffffffffff38c,
               (char *)CONCAT44(in_stack_fffffffffffff384,uVar8),in_stack_fffffffffffff37c,
               (char *)CONCAT44(in_stack_fffffffffffff374,uVar4));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff3e0,(Message *)in_stack_fffffffffffff3d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    testing::Message::~Message((Message *)0x5c85f2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5c8647);
  pstd::optional::operator_cast_to_bool(local_720 + 8);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)this_01,SUB81((ulong)this_00 >> 0x38,0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_7b8);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(in_stack_fffffffffffff394,uVar9));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff3d8,(char *)in_stack_fffffffffffff3d0,
               (char *)CONCAT17(in_stack_fffffffffffff3cf,
                                CONCAT16(in_stack_fffffffffffff3ce,
                                         CONCAT24(in_stack_fffffffffffff3cc,
                                                  in_stack_fffffffffffff3c8))),
               in_stack_fffffffffffff3c0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff394,uVar9),in_stack_fffffffffffff38c,
               (char *)CONCAT44(in_stack_fffffffffffff384,uVar8),in_stack_fffffffffffff37c,
               (char *)CONCAT44(in_stack_fffffffffffff374,uVar4));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff3e0,(Message *)in_stack_fffffffffffff3d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    std::__cxx11::string::~string(local_7e8);
    testing::Message::~Message((Message *)0x5c8779);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5c87f1);
  pstd::optional<pbrt::SquareMatrix<4>_>::operator*((optional<pbrt::SquareMatrix<4>_> *)0x5c8802);
  testing::internal::EqHelper<false>::Compare<pbrt::SquareMatrix<4>,pbrt::SquareMatrix<4>>
            ((char *)CONCAT44(in_stack_fffffffffffff37c,uVar7),
             (char *)CONCAT44(in_stack_fffffffffffff374,uVar4),
             (SquareMatrix<4> *)CONCAT44(in_stack_fffffffffffff36c,uVar6),(SquareMatrix<4> *)this_01
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_7f8);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(in_stack_fffffffffffff394,uVar9));
    testing::AssertionResult::failure_message((AssertionResult *)0x5c88a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff394,uVar9),in_stack_fffffffffffff38c,
               (char *)CONCAT44(in_stack_fffffffffffff384,uVar8),in_stack_fffffffffffff37c,
               (char *)CONCAT44(in_stack_fffffffffffff374,uVar4));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff3e0,(Message *)in_stack_fffffffffffff3d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    testing::Message::~Message((Message *)0x5c890b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5c8960);
  pstd::optional::operator_cast_to_bool(local_720 + 0x4c);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)this_01,SUB81((ulong)this_00 >> 0x38,0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_818);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(in_stack_fffffffffffff394,uVar9));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff3d8,(char *)in_stack_fffffffffffff3d0,
               (char *)CONCAT17(in_stack_fffffffffffff3cf,
                                CONCAT16(in_stack_fffffffffffff3ce,
                                         CONCAT24(in_stack_fffffffffffff3cc,
                                                  in_stack_fffffffffffff3c8))),
               in_stack_fffffffffffff3c0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff394,uVar9),in_stack_fffffffffffff38c,
               (char *)CONCAT44(in_stack_fffffffffffff384,uVar8),in_stack_fffffffffffff37c,
               (char *)CONCAT44(in_stack_fffffffffffff374,uVar4));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff3e0,(Message *)in_stack_fffffffffffff3d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    std::__cxx11::string::~string(local_848);
    testing::Message::~Message((Message *)0x5c8a92);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5c8b0a);
  pstd::optional<pbrt::SquareMatrix<4>_>::operator*((optional<pbrt::SquareMatrix<4>_> *)0x5c8b1b);
  testing::internal::EqHelper<false>::Compare<pbrt::SquareMatrix<4>,pbrt::SquareMatrix<4>>
            ((char *)CONCAT44(in_stack_fffffffffffff37c,uVar7),
             (char *)CONCAT44(in_stack_fffffffffffff374,uVar4),
             (SquareMatrix<4> *)CONCAT44(in_stack_fffffffffffff36c,uVar6),(SquareMatrix<4> *)this_01
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_858);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(in_stack_fffffffffffff394,uVar9));
    testing::AssertionResult::failure_message((AssertionResult *)0x5c8bc1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff394,uVar9),in_stack_fffffffffffff38c,
               (char *)CONCAT44(in_stack_fffffffffffff384,uVar8),in_stack_fffffffffffff37c,
               (char *)CONCAT44(in_stack_fffffffffffff374,uVar4));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff3e0,(Message *)in_stack_fffffffffffff3d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    testing::Message::~Message((Message *)0x5c8c24);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5c8c79);
  pstd::optional::operator_cast_to_bool(local_720 + 0x90);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)this_01,SUB81((ulong)this_00 >> 0x38,0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_878);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(in_stack_fffffffffffff394,uVar9));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff3d8,(char *)in_stack_fffffffffffff3d0,
               (char *)CONCAT17(in_stack_fffffffffffff3cf,
                                CONCAT16(in_stack_fffffffffffff3ce,
                                         CONCAT24(in_stack_fffffffffffff3cc,
                                                  in_stack_fffffffffffff3c8))),
               in_stack_fffffffffffff3c0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff394,uVar9),in_stack_fffffffffffff38c,
               (char *)CONCAT44(in_stack_fffffffffffff384,uVar8),in_stack_fffffffffffff37c,
               (char *)CONCAT44(in_stack_fffffffffffff374,uVar4));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff3e0,(Message *)in_stack_fffffffffffff3d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    std::__cxx11::string::~string(local_8a8);
    testing::Message::~Message((Message *)0x5c8dae);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5c8e29);
  pstd::optional<pbrt::Bounds2<int>_>::operator*((optional<pbrt::Bounds2<int>_> *)0x5c8e3d);
  testing::internal::EqHelper<false>::Compare<pbrt::Bounds2<int>,pbrt::Bounds2<int>>
            ((char *)CONCAT44(in_stack_fffffffffffff37c,uVar7),
             (char *)CONCAT44(in_stack_fffffffffffff374,uVar4),
             (Bounds2<int> *)CONCAT44(in_stack_fffffffffffff36c,uVar6),(Bounds2<int> *)this_01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_8b8);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(in_stack_fffffffffffff394,uVar9));
    testing::AssertionResult::failure_message((AssertionResult *)0x5c8ee3);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff394,uVar9),in_stack_fffffffffffff38c,
               (char *)CONCAT44(in_stack_fffffffffffff384,uVar8),in_stack_fffffffffffff37c,
               (char *)CONCAT44(in_stack_fffffffffffff374,uVar4));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff3e0,(Message *)in_stack_fffffffffffff3d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    testing::Message::~Message((Message *)0x5c8f46);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5c8f9b);
  pstd::optional::operator_cast_to_bool(local_720 + 0xa4);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)this_01,SUB81((ulong)this_00 >> 0x38,0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_8d8);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(in_stack_fffffffffffff394,uVar9));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff3d8,(char *)in_stack_fffffffffffff3d0,
               (char *)CONCAT17(in_stack_fffffffffffff3cf,
                                CONCAT16(in_stack_fffffffffffff3ce,
                                         CONCAT24(in_stack_fffffffffffff3cc,
                                                  in_stack_fffffffffffff3c8))),
               in_stack_fffffffffffff3c0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff394,uVar9),in_stack_fffffffffffff38c,
               (char *)CONCAT44(in_stack_fffffffffffff384,uVar8),in_stack_fffffffffffff37c,
               (char *)CONCAT44(in_stack_fffffffffffff374,uVar4));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff3e0,(Message *)in_stack_fffffffffffff3d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    std::__cxx11::string::~string(local_908);
    testing::Message::~Message((Message *)0x5c90d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5c914b);
  pstd::optional<pbrt::Point2<int>_>::operator*((optional<pbrt::Point2<int>_> *)0x5c915f);
  testing::internal::EqHelper<false>::Compare<pbrt::Point2<int>,pbrt::Point2<int>>
            ((char *)CONCAT44(in_stack_fffffffffffff37c,uVar7),
             (char *)CONCAT44(in_stack_fffffffffffff374,uVar4),
             (Point2<int> *)CONCAT44(in_stack_fffffffffffff36c,uVar6),(Point2<int> *)this_01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_918);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(in_stack_fffffffffffff394,uVar9));
    testing::AssertionResult::failure_message((AssertionResult *)0x5c9205);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff394,uVar9),in_stack_fffffffffffff38c,
               (char *)CONCAT44(in_stack_fffffffffffff384,uVar8),in_stack_fffffffffffff37c,
               (char *)CONCAT44(in_stack_fffffffffffff374,uVar4));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff3e0,(Message *)in_stack_fffffffffffff3d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    testing::Message::~Message((Message *)0x5c9268);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5c92c0);
  local_93c = 1;
  local_948 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
              ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                      *)0x5c92df);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((char *)CONCAT44(in_stack_fffffffffffff37c,uVar7),
             (char *)CONCAT44(in_stack_fffffffffffff374,uVar4),
             (int *)CONCAT44(in_stack_fffffffffffff36c,uVar6),(unsigned_long *)this_01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_938);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(in_stack_fffffffffffff394,uVar9));
    in_stack_fffffffffffff3e0 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x5c9383);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff394,uVar9),in_stack_fffffffffffff38c,
               (char *)CONCAT44(in_stack_fffffffffffff384,uVar8),in_stack_fffffffffffff37c,
               (char *)CONCAT44(in_stack_fffffffffffff374,uVar4));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff3e0,(Message *)in_stack_fffffffffffff3d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    testing::Message::~Message((Message *)0x5c93e6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5c943e);
  assertion_result = (AssertionResult *)local_981;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff3a0,(char *)in_stack_fffffffffffff398,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff394,uVar9));
  expression_text =
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *)this_00,(key_type *)0x5c9486);
  local_960[0]._M_node = expression_text._M_node;
  std::__cxx11::string::~string((string *)(local_981 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_981);
  local_9a0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
              *)this_00);
  std::operator!=(local_960,&local_9a0);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)this_01,SUB81((ulong)this_00 >> 0x38,0));
  uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_998);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)CONCAT44(in_stack_fffffffffffff394,uVar9));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (assertion_result,(char *)expression_text._M_node,
               (char *)CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffff3ce,
                                               CONCAT24(in_stack_fffffffffffff3cc,
                                                        in_stack_fffffffffffff3c8))),
               in_stack_fffffffffffff3c0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff394,uVar9),in_stack_fffffffffffff38c,
               (char *)CONCAT44(in_stack_fffffffffffff384,uVar8),in_stack_fffffffffffff37c,
               (char *)CONCAT44(in_stack_fffffffffffff374,uVar4));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff3e0,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    std::__cxx11::string::~string(local_9d0);
    testing::Message::~Message((Message *)0x5c962f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5c96a7);
  ppVar3 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)0x5c96b4);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](&ppVar3->second,0);
  testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff37c,uVar7),
             (char *)CONCAT44(in_stack_fffffffffffff374,uVar4),
             (char (*) [4])CONCAT44(in_stack_fffffffffffff36c,uVar6),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_9e0);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(in_stack_fffffffffffff394,uVar9));
    testing::AssertionResult::failure_message((AssertionResult *)0x5c9754);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff394,uVar9),in_stack_fffffffffffff38c,
               (char *)CONCAT44(in_stack_fffffffffffff384,uVar8),in_stack_fffffffffffff37c,
               (char *)CONCAT44(in_stack_fffffffffffff374,uVar4));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff3e0,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    testing::Message::~Message((Message *)0x5c97b1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5c9806);
  ppVar3 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)0x5c9813);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](&ppVar3->second,1);
  testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff37c,uVar7),
             (char *)CONCAT44(in_stack_fffffffffffff374,uVar4),
             (char (*) [4])CONCAT44(in_stack_fffffffffffff36c,uVar6),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_a00);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(in_stack_fffffffffffff394,uVar9));
    testing::AssertionResult::failure_message((AssertionResult *)0x5c98b4);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff394,uVar9),in_stack_fffffffffffff38c,
               (char *)CONCAT44(in_stack_fffffffffffff384,uVar8),in_stack_fffffffffffff37c,
               (char *)CONCAT44(in_stack_fffffffffffff374,uVar4));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff3e0,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    testing::Message::~Message((Message *)0x5c9911);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5c9969);
  __filename = (char *)std::__cxx11::string::c_str();
  remove(__filename);
  testing::internal::EqHelper<true>::Compare<int,int>
            ((char *)CONCAT44(in_stack_fffffffffffff37c,uVar7),
             (char *)CONCAT44(in_stack_fffffffffffff374,uVar4),
             (int *)CONCAT44(in_stack_fffffffffffff36c,uVar6),(int *)this_01,this_00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_a20);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(in_stack_fffffffffffff394,uVar9));
    testing::AssertionResult::failure_message((AssertionResult *)0x5c9a2b);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff394,uVar9),in_stack_fffffffffffff38c,
               (char *)CONCAT44(in_stack_fffffffffffff384,uVar8),in_stack_fffffffffffff37c,
               (char *)CONCAT44(in_stack_fffffffffffff374,uVar4));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff3e0,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    testing::Message::~Message((Message *)0x5c9a88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5c9add);
  pbrt::ImageAndMetadata::~ImageAndMetadata(this_01);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          *)0x5c9af7);
  pbrt::ImageMetadata::~ImageMetadata((ImageMetadata *)this_01);
  std::__cxx11::string::~string(local_240);
  pbrt::Image::~Image(&this_01->image);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
            ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)this_01);
  return;
}

Assistant:

TEST(Image, ExrMetadata) {
    Point2i res(16, 32);
    pstd::vector<float> rgbPixels = GetFloatPixels(res, 3);
    Image image(rgbPixels, res, {"R", "G", "B"});

    std::string filename = "metadata.exr";
    ImageMetadata outMetadata;
    outMetadata.colorSpace = RGBColorSpace::Rec2020;
    outMetadata.renderTimeSeconds = 1234;
    SquareMatrix<4> w2c(3, 1, 4, 1, 5, 9, 2, Pi, 2, 7, 1, 8, 2, 8, 1, std::exp(1.f));
    SquareMatrix<4> w2n(1.5, 2.5, 3.5, 4.75, 5.333, 6.2135, -351.2, -552., 63.2, 47.2, Pi,
                        std::cos(1.f), 0, -14, 6, 1e-10f);
    // Must be the same area as image resolution.
    Bounds2i pb(Point2i(2, 10), Point2i(18, 42));
    Point2i fullRes(1000, 200);
    std::map<std::string, std::vector<std::string>> stringVectors;
    stringVectors["yolo"] = {"foo", "bar"};

    outMetadata.cameraFromWorld = w2c;
    outMetadata.NDCFromWorld = w2n;
    outMetadata.pixelBounds = pb;
    outMetadata.fullResolution = fullRes;
    outMetadata.stringVectors = stringVectors;
    EXPECT_TRUE(image.Write(filename, outMetadata));

    ImageAndMetadata read = Image::Read(filename);
    ImageMetadata &inMetadata = read.metadata;

    EXPECT_EQ(*RGBColorSpace::Rec2020, *inMetadata.GetColorSpace());

    EXPECT_TRUE((bool)inMetadata.renderTimeSeconds);
    EXPECT_EQ(1234, *inMetadata.renderTimeSeconds);

    EXPECT_TRUE((bool)inMetadata.cameraFromWorld);
    EXPECT_EQ(*inMetadata.cameraFromWorld, w2c);

    EXPECT_TRUE((bool)inMetadata.NDCFromWorld);
    EXPECT_EQ(*inMetadata.NDCFromWorld, w2n);

    EXPECT_TRUE((bool)inMetadata.pixelBounds);
    EXPECT_EQ(*inMetadata.pixelBounds, pb);

    EXPECT_TRUE((bool)inMetadata.fullResolution);
    EXPECT_EQ(*inMetadata.fullResolution, fullRes);

    EXPECT_EQ(1, inMetadata.stringVectors.size());
    auto iter = stringVectors.find("yolo");
    EXPECT_TRUE(iter != stringVectors.end());
    EXPECT_EQ("foo", iter->second[0]);
    EXPECT_EQ("bar", iter->second[1]);

    EXPECT_EQ(0, remove(filename.c_str()));
}